

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::HDF5DataParameter::MergePartialFromCodedStream
          (HDF5DataParameter *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  int64 iVar9;
  int iVar10;
  UnknownFieldSet *unknown_fields;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  
  this_00 = &this->source_;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003af986;
      input->buffer_ = pbVar3 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003af986:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_003af9a7;
    uVar8 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (uVar8 == 3) {
      if (cVar11 != '\x18') goto LAB_003af9a7;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar5 + 1;
        pVar13._8_8_ = 1;
        pVar13.first = (long)(char)uVar2;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar10 = 6;
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->shuffle_ = pVar13.first != 0;
        goto LAB_003af9e0;
      }
    }
    else if (uVar8 == 2) {
      if (cVar11 == '\x10') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->batch_size_ = (uint)bVar1;
            input->buffer_ = pbVar3 + 1;
            goto LAB_003af9e0;
          }
        }
        else {
          uVar7 = 0;
        }
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->batch_size_ = (uint32)iVar9;
        iVar10 = 6;
        if (-1 < iVar9) goto LAB_003af9e0;
        goto LAB_003af9e2;
      }
LAB_003af9a7:
      iVar10 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar4 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        iVar10 = 6;
        if (bVar6) goto LAB_003af9e0;
      }
    }
    else {
      if ((uVar8 != 1) || (cVar11 != '\n')) goto LAB_003af9a7;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->source_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
      iVar10 = 6;
      if (!bVar6) goto LAB_003af9e2;
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                 "caffe.HDF5DataParameter.source");
LAB_003af9e0:
      iVar10 = 0;
    }
LAB_003af9e2:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool HDF5DataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.HDF5DataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.HDF5DataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool shuffle = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_shuffle();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &shuffle_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.HDF5DataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.HDF5DataParameter)
  return false;
#undef DO_
}